

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedMap.hpp
# Opt level: O2

void __thiscall
binlog::detail::SegmentedMap<binlog::EventSource>::emplace<binlog::EventSource>
          (SegmentedMap<binlog::EventSource> *this,key_type key,EventSource *args)

{
  pointer puVar1;
  pointer pvVar2;
  key_type kVar3;
  ulong uVar4;
  ulong uVar5;
  initializer_list<binlog::EventSource> __l;
  allocator_type local_109;
  key_type key_local;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> local_100;
  EventSource local_e8;
  
  key_local = key;
  kVar3 = segmentIndex(this,key);
  puVar1 = (this->_offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->_segments).
           super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = key - puVar1[kVar3];
  uVar4 = ((long)*(pointer *)
                  ((long)&pvVar2[kVar3].
                          super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>
                          ._M_impl.super__Vector_impl_data + 8) -
          *(long *)&pvVar2[kVar3].
                    super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>.
                    _M_impl.super__Vector_impl_data) / 0xb8;
  if (uVar4 == uVar5) {
    std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::
    emplace_back<binlog::EventSource>(pvVar2 + kVar3,args);
    return;
  }
  if (uVar5 < uVar4) {
    EventSource::EventSource(&local_e8,args);
    EventSource::operator=
              (pvVar2[kVar3].
               super__Vector_base<binlog::EventSource,_std::allocator<binlog::EventSource>_>._M_impl
               .super__Vector_impl_data._M_start + uVar5,&local_e8);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
              (&this->_offsets,(const_iterator)(puVar1 + kVar3 + 1),&key_local);
    pvVar2 = (this->_segments).
             super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    EventSource::EventSource(&local_e8,args);
    __l._M_len = 1;
    __l._M_array = &local_e8;
    std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::vector
              (&local_100,__l,&local_109);
    std::
    vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
    ::_M_insert_rval(&this->_segments,pvVar2 + kVar3 + 1,&local_100);
    std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::~vector(&local_100);
  }
  EventSource::~EventSource(&local_e8);
  return;
}

Assistant:

void emplace(const key_type key, Args&&... args)
  {
    const key_type si = segmentIndex(key);
    const key_type offset = _offsets[si];
    const key_type vi = key - offset;
    Segment& segment = _segments[si];

    if (segment.size() == vi)
    {
      segment.emplace_back(std::forward<Args>(args)...);
    }
    else if (segment.size() > vi)
    {
      segment[vi] = mapped_type(std::forward<Args>(args)...);
    }
    else
    {
      const auto ito = std::vector<key_type>::iterator::difference_type(si + 1);
      _offsets.insert(_offsets.begin() + ito, key);
      _segments.emplace(_segments.begin() + ito, Segment{mapped_type(std::forward<Args>(args)...)});
    }
  }